

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O1

int Abc_NtkEliminateSpecial(Abc_Ntk_t *pNtk,int nMaxSize,int fVerbose)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *vNodes;
  void **ppvVar7;
  int *pPermFanin;
  int *pPermFanout;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  if (nMaxSize < 1) {
    __assert_fail("nMaxSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                  ,0x2db,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                  ,0x2dc,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
  }
  iVar5 = Abc_NtkToBdd(pNtk);
  if (iVar5 != 0) {
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    Abc_NtkCleanup(pNtk,0);
    iVar5 = Abc_NtkToSop(pNtk,-1,1000000000);
    if (iVar5 == 0) {
      fwrite("Converting to SOP has failed.\n",0x1e,1,_stdout);
      return 0;
    }
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 1000;
    vNodes->nSize = 0;
    ppvVar7 = (void **)malloc(8000);
    vNodes->pArray = ppvVar7;
    pVVar8 = pNtk->vObjs;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
        if (((((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
             ((pAVar3->vFanouts).nSize == 1)) &&
            ((pAVar9 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray],
             (*(uint *)&pAVar9->field_0x14 & 0xf) == 7 &&
             (iVar5 = Abc_SopGetCubeNum((char *)(pAVar3->field_5).pData), iVar5 == 1)))) &&
           (iVar5 = Abc_SopGetCubeNum((char *)(pAVar9->field_5).pData), iVar5 == 1)) {
          iVar5 = Abc_NodeFindFanin(pAVar9,pAVar3);
          if ((iVar5 < 0) || ((pAVar9->vFanins).nSize <= iVar5)) {
            __assert_fail("RetValue >= 0 && RetValue < Abc_ObjFaninNum(pFanout)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                          ,0x301,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
          }
          iVar6 = Abc_SopIsComplement((char *)(pAVar3->field_5).pData);
          iVar5 = Abc_SopGetIthCareLit((char *)(pAVar9->field_5).pData,iVar5);
          if (iVar6 != iVar5) {
            uVar1 = vNodes->nSize;
            uVar2 = vNodes->nCap;
            if (uVar1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
                }
                iVar5 = 0x10;
              }
              else {
                iVar5 = uVar2 * 2;
                if (iVar5 <= (int)uVar2) goto LAB_001df2f9;
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
                }
              }
              vNodes->pArray = ppvVar7;
              vNodes->nCap = iVar5;
            }
LAB_001df2f9:
            vNodes->nSize = uVar1 + 1;
            vNodes->pArray[(int)uVar1] = pAVar3;
          }
        }
        lVar12 = lVar12 + 1;
        pVVar8 = pNtk->vObjs;
      } while (lVar12 < pVVar8->nSize);
    }
    uVar1 = vNodes->nSize;
    if ((ulong)uVar1 == 0) {
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (void **)0x0;
      }
      free(vNodes);
      return 1;
    }
    Abc_ObjSortInReverseOrder(pNtk,vNodes);
    iVar5 = Abc_NtkToBdd(pNtk);
    if (iVar5 != 0) {
      __size = (ulong)(uint)nMaxSize * 4 + 4000;
      pPermFanin = (int *)malloc(__size);
      pPermFanout = (int *)malloc(__size);
      pVVar8 = (Vec_Ptr_t *)malloc(0x10);
      pVVar8->nCap = 1000;
      pVVar8->nSize = 0;
      ppvVar7 = (void **)malloc(8000);
      pVVar8->pArray = ppvVar7;
      vNodes_00 = (Vec_Ptr_t *)malloc(0x10);
      vNodes_00->nCap = 1000;
      vNodes_00->nSize = 0;
      ppvVar7 = (void **)malloc(8000);
      vNodes_00->pArray = ppvVar7;
      if (0 < (int)uVar1) {
        ppvVar7 = vNodes->pArray;
        uVar11 = 0;
        do {
          pAVar3 = (Abc_Obj_t *)ppvVar7[uVar11];
          if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 7) {
            __assert_fail("Abc_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                          ,0x31c,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
          }
          pAVar9 = Abc_NodeFindCoFanout(pAVar3);
          if (pAVar9 != (Abc_Obj_t *)0x0) {
            __assert_fail("Abc_NodeFindCoFanout(pNode) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                          ,0x31d,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
          }
          Abc_NodeCollectFanouts(pAVar3,vNodes_00);
          if (0 < vNodes_00->nSize) {
            lVar12 = 0;
            do {
              pAVar9 = (Abc_Obj_t *)vNodes_00->pArray[lVar12];
              if (fVerbose != 0) {
                printf("Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                       (ulong)(uint)pAVar3->Id,(ulong)(uint)(pAVar3->vFanins).nSize,
                       (ulong)(uint)pAVar9->Id,(ulong)(uint)(pAVar9->vFanins).nSize);
              }
              iVar5 = Abc_NodeCollapse(pAVar3,pAVar9,pVVar8,pPermFanin,pPermFanout);
              if (iVar5 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                              ,0x326,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
              }
              if (fVerbose != 0) {
                lVar10 = (long)pNtk->vObjs->nSize;
                if (lVar10 < 1) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pvVar4 = pNtk->vObjs->pArray[lVar10 + -1];
                if (pvVar4 != (void *)0x0) {
                  printf("resulting in node %5d (supp =%2d).\n",
                         (ulong)*(uint *)((long)pvVar4 + 0x10),(ulong)*(uint *)((long)pvVar4 + 0x1c)
                        );
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < vNodes_00->nSize);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar1);
      }
      Abc_NtkBddReorder(pNtk,0);
      if (pVVar8->pArray != (void **)0x0) {
        free(pVVar8->pArray);
        pVVar8->pArray = (void **)0x0;
      }
      free(pVVar8);
      if (vNodes_00->pArray != (void **)0x0) {
        free(vNodes_00->pArray);
        vNodes_00->pArray = (void **)0x0;
      }
      free(vNodes_00);
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (void **)0x0;
      }
      free(vNodes);
      if (pPermFanin != (int *)0x0) {
        free(pPermFanin);
      }
      if (pPermFanout == (int *)0x0) {
        return 1;
      }
      free(pPermFanout);
      return 1;
    }
  }
  fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
  return 0;
}

Assistant:

int Abc_NtkEliminateSpecial( Abc_Ntk_t * pNtk, int nMaxSize, int fVerbose )
{
    extern void Abc_NtkBddReorder( Abc_Ntk_t * pNtk, int fVerbose );
    Vec_Ptr_t * vFanouts, * vFanins, * vNodes;
    Abc_Obj_t * pNode, * pFanout;
    int * pPermFanin, * pPermFanout;
    int RetValue, i, k;
    assert( nMaxSize > 0 );
    assert( Abc_NtkIsLogic(pNtk) ); 


    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }

    // prepare nodes for sweeping
    Abc_NtkRemoveDupFanins( pNtk );
    Abc_NtkMinimumBase( pNtk );
    Abc_NtkCleanup( pNtk, 0 );

    // convert network to SOPs
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        fprintf( stdout, "Converting to SOP has failed.\n" );
        return 0;
    }

    // collect info about the nodes to be eliminated
    vNodes = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFanoutNum(pNode) != 1 )
            continue;
        pFanout = Abc_ObjFanout0(pNode);
        if ( !Abc_ObjIsNode(pFanout) )
            continue;
        if ( Abc_SopGetCubeNum((char *)pNode->pData) != 1 )
            continue;
        if ( Abc_SopGetCubeNum((char *)pFanout->pData) != 1 )
            continue;
        // find the fanout's fanin
        RetValue = Abc_NodeFindFanin( pFanout, pNode );
        assert( RetValue >= 0 && RetValue < Abc_ObjFaninNum(pFanout) );
        // both pNode and pFanout are AND/OR type nodes
        if ( Abc_SopIsComplement((char *)pNode->pData) == Abc_SopGetIthCareLit((char *)pFanout->pData, RetValue) )
            continue;
        Vec_PtrPush( vNodes, pNode );
    }
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrFree( vNodes );
        return 1;
    }
    Abc_ObjSortInReverseOrder( pNtk, vNodes );

    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }

    // go through the nodes and decide is they can be eliminated
    pPermFanin = ABC_ALLOC( int, nMaxSize + 1000 );
    pPermFanout = ABC_ALLOC( int, nMaxSize + 1000 );
    vFanins = Vec_PtrAlloc( 1000 );
    vFanouts = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        assert( Abc_ObjIsNode(pNode) );
        assert( Abc_NodeFindCoFanout(pNode) == NULL );
        // perform elimination
        Abc_NodeCollectFanouts( pNode, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
        {
            if ( fVerbose )
                printf( "Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                    Abc_ObjId(pNode), Abc_ObjFaninNum(pNode), Abc_ObjId(pFanout), Abc_ObjFaninNum(pFanout) ); 
            RetValue = Abc_NodeCollapse( pNode, pFanout, vFanins, pPermFanin, pPermFanout );
            assert( RetValue );
            if ( fVerbose )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk) - 1 );
                if ( pNodeNew )
                    printf( "resulting in node %5d (supp =%2d).\n", Abc_ObjId(pNodeNew), Abc_ObjFaninNum(pNodeNew) );
            }
        }
    }
    Abc_NtkBddReorder( pNtk, 0 );
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    ABC_FREE( pPermFanin );
    ABC_FREE( pPermFanout );
    return 1;
}